

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O1

uint dxil_spv::emit_buffer_store_values_bitcast
               (Impl *impl,CallInst *instruction,Id *store_values,uint write_mask,RawWidth raw_width
               ,bool is_typed,bool ignore_bitcast)

{
  bool bVar1;
  Id IVar2;
  TypeID TVar3;
  uint uVar4;
  Value *pVVar5;
  Type *data_type;
  Builder *this;
  Operation *pOVar6;
  byte bVar7;
  uint uVar8;
  long lVar9;
  Op op;
  
  pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,4);
  data_type = LLVMBC::Value::getType(pVVar5);
  this = Converter::Impl::builder(impl);
  bVar7 = 6;
  if (raw_width < Count) {
    bVar7 = (char)(0x70503ff >> ((char)raw_width * '\b' & 0x1fU)) + 1;
  }
  lVar9 = 0;
  uVar4 = 0;
  do {
    uVar8 = (uint)lVar9;
    if ((write_mask >> (uVar8 & 0x1f) & 1) != 0) {
      pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar8 + 4);
      Converter::Impl::register_externally_visible_write(impl,pVVar5);
      pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar8 + 4);
      IVar2 = Converter::Impl::get_id_for_value(impl,pVVar5,0);
      store_values[lVar9] = IVar2;
      if (!is_typed) {
        if (((impl->execution_mode_meta).native_16bit_operations == false) &&
           ((impl->options).min_precision_prefer_native_16bit == true)) {
          bVar1 = type_is_16bit(data_type);
          if (!bVar1) goto LAB_001788bd;
          TVar3 = LLVMBC::Type::getTypeID(data_type);
          if (TVar3 == HalfTyID) {
            IVar2 = spv::Builder::makeFloatType(this,0x20);
            pOVar6 = Converter::Impl::allocate(impl,OpFConvert,IVar2);
            Operation::add_id(pOVar6,store_values[lVar9]);
            store_values[lVar9] = pOVar6->id;
            Converter::Impl::add(impl,pOVar6,false);
            if (!ignore_bitcast) {
              IVar2 = spv::Builder::makeIntegerType(this,0x20,false);
              pOVar6 = Converter::Impl::allocate(impl,OpBitcast,IVar2);
              Operation::add_id(pOVar6,store_values[lVar9]);
              Converter::Impl::add(impl,pOVar6,false);
              store_values[lVar9] = pOVar6->id;
            }
            goto LAB_00178969;
          }
          IVar2 = spv::Builder::makeIntegerType(this,0x20,false);
          op = OpUConvert;
LAB_0017893e:
          pOVar6 = Converter::Impl::allocate(impl,op,IVar2);
          Operation::add_id(pOVar6,store_values[lVar9]);
          store_values[lVar9] = pOVar6->id;
          Converter::Impl::add(impl,pOVar6,false);
        }
        else {
LAB_001788bd:
          if (!ignore_bitcast) {
            TVar3 = LLVMBC::Type::getTypeID(data_type);
            if (TVar3 != DoubleTyID) {
              TVar3 = LLVMBC::Type::getTypeID(data_type);
              if (TVar3 != IntegerTyID) {
                if ((8 < bVar7) || (((0x151U >> (bVar7 & 0x1f) ^ 1) & 1) != 0)) {
                  __assert_fail("0 && \"Invalid component type.\"",
                                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/opcodes/converter_impl.hpp"
                                ,0x7a,
                                "unsigned int dxil_spv::raw_component_type_to_bits(DXIL::ComponentType)"
                               );
                }
                IVar2 = spv::Builder::makeIntegerType
                                  (this,(&switchD_00177fab::switchdataD_001c7898)[bVar7],false);
                op = OpBitcast;
                goto LAB_0017893e;
              }
            }
          }
        }
      }
LAB_00178969:
      uVar4 = uVar8 + 1;
    }
    lVar9 = lVar9 + 1;
    if (lVar9 == 4) {
      return uVar4;
    }
  } while( true );
}

Assistant:

static unsigned emit_buffer_store_values_bitcast(Converter::Impl &impl, const llvm::CallInst *instruction,
                                                 spv::Id *store_values, unsigned write_mask,
                                                 RawWidth raw_width,
                                                 bool is_typed, bool ignore_bitcast)
{
	auto *element_type = instruction->getOperand(4)->getType();
	auto &builder = impl.builder();
	unsigned raw_vecsize = 0;

	for (unsigned i = 0; i < 4; i++)
	{
		if ((write_mask & (1u << i)) != 0)
		{
			impl.register_externally_visible_write(instruction->getOperand(4 + i));
			store_values[i] = impl.get_id_for_value(instruction->getOperand(4 + i));
			if (!is_typed)
			{
				// If we're storing to min16 types and we use native 16-bit in arithmetic,
				// we have to expand to 32-bit before storing :(
				// This will probably fall over with int vs uint, since we don't know how to sign-extend.
				if (!impl.execution_mode_meta.native_16bit_operations &&
				    impl.options.min_precision_prefer_native_16bit &&
				    type_is_16bit(element_type))
				{
					if (element_type->getTypeID() == llvm::Type::TypeID::HalfTyID)
					{
						Operation *op = impl.allocate(spv::OpFConvert, builder.makeFloatType(32));
						op->add_id(store_values[i]);
						store_values[i] = op->id;
						impl.add(op);

						if (!ignore_bitcast)
						{
							Operation *bitcast_op = impl.allocate(spv::OpBitcast, builder.makeUintType(32));
							bitcast_op->add_id(store_values[i]);
							impl.add(bitcast_op);
							store_values[i] = bitcast_op->id;
						}
					}
					else
					{
						// SConvert or UConvert, who knows. :)
						Operation *op = impl.allocate(spv::OpUConvert, builder.makeUintType(32));
						op->add_id(store_values[i]);
						store_values[i] = op->id;
						impl.add(op);
					}
				}
				else if (!ignore_bitcast &&
				         element_type->getTypeID() != llvm::Type::TypeID::DoubleTyID &&
				         element_type->getTypeID() != llvm::Type::TypeID::IntegerTyID)
				{
					Operation *op = impl.allocate(spv::OpBitcast, builder.makeUintType(raw_width_to_bits(raw_width)));
					op->add_id(store_values[i]);
					store_values[i] = op->id;
					impl.add(op);
				}
			}

			raw_vecsize = i + 1;
		}
	}

	return raw_vecsize;
}